

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void us_socket_timeout(int ssl,us_socket_t *s,uint seconds)

{
  unsigned_short local_1c;
  unsigned_short timeout_sweeps;
  uint seconds_local;
  us_socket_t *s_local;
  int ssl_local;
  
  if (seconds == 0) {
    s->timeout = 0;
  }
  else {
    local_1c = (unsigned_short)(int)((float)seconds * 0.25 + 0.5);
    if (local_1c == 0) {
      local_1c = 1;
    }
    s->timeout = local_1c;
  }
  return;
}

Assistant:

void us_socket_timeout(int ssl, struct us_socket_t *s, unsigned int seconds) {
    if (seconds) {
        unsigned short timeout_sweeps = (unsigned short) (0.5f + ((float) seconds) / ((float) LIBUS_TIMEOUT_GRANULARITY));
        s->timeout = timeout_sweeps ? timeout_sweeps : 1;
    } else {
        s->timeout = 0;
    }
}